

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O2

void __thiscall
HighsSplitDeque::HighsSplitDeque
          (HighsSplitDeque *this,shared_ptr<WorkerBunk> *workerBunk,
          unique_ptr<HighsSplitDeque> *workers,int ownerId,int numWorkers)

{
  OwnerData::OwnerData(&this->ownerData);
  StealerData::StealerData(&this->stealerData);
  (this->workerBunkData).nextSleeper._M_b._M_p = (__pointer_type)0x0;
  (this->ownerData).ownerId = ownerId;
  (this->ownerData).workers = workers;
  (this->ownerData).numWorkers = numWorkers;
  (this->workerBunkData).ownerId = ownerId;
  HighsRandom::initialise(&(this->ownerData).randgen,ownerId);
  std::__shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2> *)this,
             &workerBunk->
              super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>);
  (this->splitRequest)._M_base._M_i = false;
  return;
}

Assistant:

HighsSplitDeque(const cache_aligned::shared_ptr<WorkerBunk>& workerBunk,
                  cache_aligned::unique_ptr<HighsSplitDeque>* workers,
                  int ownerId, int numWorkers) {
    ownerData.ownerId = ownerId;
    ownerData.workers = workers;
    ownerData.numWorkers = numWorkers;
    workerBunkData.ownerId = ownerId;
    ownerData.randgen.initialise(ownerId);
    ownerData.workerBunk = workerBunk;
    splitRequest.store(false, std::memory_order_relaxed);

    assert((reinterpret_cast<uintptr_t>(this) & 63u) == 0);
    static_assert(offsetof(HighsSplitDeque, splitRequest) == 64,
                  "alignas failed to guarantee 64 byte alignment");
    static_assert(offsetof(HighsSplitDeque, stealerData) == 128,
                  "alignas failed to guarantee 64 byte alignment");
    static_assert(offsetof(HighsSplitDeque, workerBunkData) == 192,
                  "alignas failed to guarantee 64 byte alignment");
    static_assert(offsetof(HighsSplitDeque, taskArray) == 256,
                  "alignas failed to guarantee 64 byte alignment");
  }